

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O0

void __thiscall
Employee::Employee(Employee *this,string *name,string *id,Address *address,int hourWork,
                  int salaryPerHour,int workToDo,int workDone)

{
  int salaryPerHour_local;
  int hourWork_local;
  Address *address_local;
  string *id_local;
  string *name_local;
  Employee *this_local;
  
  Person::Person(&this->super_Person,name,id,address);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_validate_0010bd48;
  this->hourWork = hourWork;
  this->salaryPerHour = salaryPerHour;
  this->workToDo = workToDo;
  this->workDone = workDone;
  (**(this->super_Person)._vptr_Person)();
  return;
}

Assistant:

Employee::Employee(const string &name, const string &id, const Address &address, int hourWork, int salaryPerHour,
                   int workToDo, int workDone) : Person(name, id, address), hourWork(hourWork),
                                                 salaryPerHour(salaryPerHour), workToDo(workToDo),
                                                 workDone(workDone) { validate(); }